

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFExpression::Operation::extract
          (Operation *this,DataExtractor Data,uint16_t Version,uint8_t AddressSize,uint64_t Offset)

{
  Encoding EVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  Description DVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  uint Signed;
  uint Size;
  uint Operand;
  uint64_t Offset_local;
  uint8_t AddressSize_local;
  Operation *pOStack_18;
  uint16_t Version_local;
  Operation *this_local;
  
  _Operand = Offset;
  Offset_local._5_1_ = AddressSize;
  Offset_local._6_2_ = Version;
  pOStack_18 = this;
  uVar2 = DataExtractor::getU8(&Data,(uint64_t *)&Operand,(Error *)0x0);
  this->Opcode = uVar2;
  DVar5 = getOpDesc((uint)this->Opcode);
  (this->Desc).Version = (char)DVar5._0_2_;
  (this->Desc).Op[0] = (char)((ushort)DVar5._0_2_ >> 8);
  (this->Desc).Op[1] = DVar5.Op[1];
  if ((this->Desc).Version == DwarfNA) {
    this->EndOffset = _Operand;
    this_local._7_1_ = false;
  }
  else {
    for (Signed = 0; Signed < 2; Signed = Signed + 1) {
      EVar1 = (this->Desc).Op[Signed];
      if (EVar1 == SizeNA) break;
      switch(EVar1 & ~SignBit) {
      case Size1:
        bVar3 = DataExtractor::getU8(&Data,(uint64_t *)&Operand,(Error *)0x0);
        this->Operands[Signed] = (ulong)bVar3;
        if ((EVar1 & SignBit) != Size1) {
          this->Operands[Signed] = (long)(char)this->Operands[Signed];
        }
        break;
      case Size2:
        uVar4 = DataExtractor::getU16(&Data,(uint64_t *)&Operand,(Error *)0x0);
        this->Operands[Signed] = (ulong)uVar4;
        if ((EVar1 & SignBit) != Size1) {
          this->Operands[Signed] = (long)(short)this->Operands[Signed];
        }
        break;
      case Size4:
        uVar6 = DataExtractor::getU32(&Data,(uint64_t *)&Operand,(Error *)0x0);
        this->Operands[Signed] = (ulong)uVar6;
        if ((EVar1 & SignBit) != Size1) {
          this->Operands[Signed] = (long)(int)this->Operands[Signed];
        }
        break;
      case Size8:
        uVar7 = DataExtractor::getU64(&Data,(uint64_t *)&Operand,(Error *)0x0);
        this->Operands[Signed] = uVar7;
        break;
      case SizeLEB:
        if ((EVar1 & SignBit) == Size1) {
          uVar7 = DataExtractor::getULEB128(&Data,(uint64_t *)&Operand,(Error *)0x0);
          this->Operands[Signed] = uVar7;
        }
        else {
          uVar7 = DataExtractor::getSLEB128(&Data,(uint64_t *)&Operand);
          this->Operands[Signed] = uVar7;
        }
        break;
      case SizeAddr:
        if (Offset_local._5_1_ == '\b') {
          uVar7 = DataExtractor::getU64(&Data,(uint64_t *)&Operand,(Error *)0x0);
          this->Operands[Signed] = uVar7;
        }
        else if (Offset_local._5_1_ == '\x04') {
          uVar6 = DataExtractor::getU32(&Data,(uint64_t *)&Operand,(Error *)0x0);
          this->Operands[Signed] = (ulong)uVar6;
        }
        else {
          if (Offset_local._5_1_ != '\x02') {
            __assert_fail("AddressSize == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                          ,0xa5,
                          "bool llvm::DWARFExpression::Operation::extract(DataExtractor, uint16_t, uint8_t, uint64_t)"
                         );
          }
          uVar4 = DataExtractor::getU16(&Data,(uint64_t *)&Operand,(Error *)0x0);
          this->Operands[Signed] = (ulong)uVar4;
        }
        break;
      case SizeRefAddr:
        uVar2 = getRefAddrSize(Offset_local._5_1_,Offset_local._6_2_);
        if (uVar2 == '\b') {
          uVar7 = DataExtractor::getU64(&Data,(uint64_t *)&Operand,(Error *)0x0);
          this->Operands[Signed] = uVar7;
        }
        else {
          uVar2 = getRefAddrSize(Offset_local._5_1_,Offset_local._6_2_);
          if (uVar2 == '\x04') {
            uVar6 = DataExtractor::getU32(&Data,(uint64_t *)&Operand,(Error *)0x0);
            this->Operands[Signed] = (ulong)uVar6;
          }
          else {
            uVar2 = getRefAddrSize(Offset_local._5_1_,Offset_local._6_2_);
            if (uVar2 != '\x02') {
              __assert_fail("getRefAddrSize(AddressSize, Version) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                            ,0xaf,
                            "bool llvm::DWARFExpression::Operation::extract(DataExtractor, uint16_t, uint8_t, uint64_t)"
                           );
            }
            uVar4 = DataExtractor::getU16(&Data,(uint64_t *)&Operand,(Error *)0x0);
            this->Operands[Signed] = (ulong)uVar4;
          }
        }
        break;
      case SizeBlock:
        if (Signed == 0) {
          return false;
        }
        this->Operands[Signed] = _Operand;
        _Operand = this->Operands[Signed - 1] + _Operand;
        break;
      case BaseTypeRef:
        uVar7 = DataExtractor::getULEB128(&Data,(uint64_t *)&Operand,(Error *)0x0);
        this->Operands[Signed] = uVar7;
        break;
      default:
        llvm_unreachable_internal
                  ("Unknown DWARFExpression Op size",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                   ,0xc5);
      }
      this->OperandEndOffsets[Signed] = _Operand;
    }
    this->EndOffset = _Operand;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DWARFExpression::Operation::extract(DataExtractor Data, uint16_t Version,
                                         uint8_t AddressSize, uint64_t Offset) {
  Opcode = Data.getU8(&Offset);

  Desc = getOpDesc(Opcode);
  if (Desc.Version == Operation::DwarfNA) {
    EndOffset = Offset;
    return false;
  }

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];
    unsigned Signed = Size & Operation::SignBit;

    if (Size == Operation::SizeNA)
      break;

    switch (Size & ~Operation::SignBit) {
    case Operation::Size1:
      Operands[Operand] = Data.getU8(&Offset);
      if (Signed)
        Operands[Operand] = (int8_t)Operands[Operand];
      break;
    case Operation::Size2:
      Operands[Operand] = Data.getU16(&Offset);
      if (Signed)
        Operands[Operand] = (int16_t)Operands[Operand];
      break;
    case Operation::Size4:
      Operands[Operand] = Data.getU32(&Offset);
      if (Signed)
        Operands[Operand] = (int32_t)Operands[Operand];
      break;
    case Operation::Size8:
      Operands[Operand] = Data.getU64(&Offset);
      break;
    case Operation::SizeAddr:
      if (AddressSize == 8) {
        Operands[Operand] = Data.getU64(&Offset);
      } else if (AddressSize == 4) {
        Operands[Operand] = Data.getU32(&Offset);
      } else {
        assert(AddressSize == 2);
        Operands[Operand] = Data.getU16(&Offset);
      }
      break;
    case Operation::SizeRefAddr:
      if (getRefAddrSize(AddressSize, Version) == 8) {
        Operands[Operand] = Data.getU64(&Offset);
      } else if (getRefAddrSize(AddressSize, Version) == 4) {
        Operands[Operand] = Data.getU32(&Offset);
      } else {
        assert(getRefAddrSize(AddressSize, Version) == 2);
        Operands[Operand] = Data.getU16(&Offset);
      }
      break;
    case Operation::SizeLEB:
      if (Signed)
        Operands[Operand] = Data.getSLEB128(&Offset);
      else
        Operands[Operand] = Data.getULEB128(&Offset);
      break;
    case Operation::BaseTypeRef:
      Operands[Operand] = Data.getULEB128(&Offset);
      break;
    case Operation::SizeBlock:
      // We need a size, so this cannot be the first operand
      if (Operand == 0)
        return false;
      // Store the offset of the block as the value.
      Operands[Operand] = Offset;
      Offset += Operands[Operand - 1];
      break;
    default:
      llvm_unreachable("Unknown DWARFExpression Op size");
    }

    OperandEndOffsets[Operand] = Offset;
  }

  EndOffset = Offset;
  return true;
}